

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::UpdateTransformState(Element *this)

{
  undefined1 *puVar1;
  float fVar2;
  undefined4 uVar3;
  Vector2f VVar4;
  undefined4 uVar5;
  ElementMeta *pEVar6;
  Vector2f VVar7;
  RareValues RVar8;
  VectorType VVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  byte bVar18;
  uint uVar19;
  Matrix4f *pMVar20;
  TransformState *pTVar21;
  TransformPrimitive *p;
  pointer puVar22;
  ulong uVar23;
  byte bVar24;
  pointer __old_p;
  bool bVar25;
  float fVar26;
  uint uVar27;
  float fVar28;
  uint uVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ThisType result;
  TransformPtr transform_ptr;
  Matrix4f matrix;
  ThisType result_2;
  ThisType result_1;
  float local_1a8;
  float fStack_1a4;
  float local_198;
  float fStack_194;
  Matrix4f local_188;
  MatrixAType local_148;
  Element *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  Matrix4f local_f8;
  MatrixBType local_b8;
  MatrixAType local_78;
  
  if ((this->field_0x17 & 0x60) == 0) {
    return;
  }
  pEVar6 = this->meta;
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  VVar4 = this->absolute_offset;
  VVar7 = Box::GetSize(&this->main_box,Border);
  bVar18 = this->field_0x17;
  bVar25 = false;
  bVar24 = 0;
  local_198 = VVar4.x;
  fStack_194 = VVar4.y;
  local_1a8 = VVar7.x;
  fStack_1a4 = VVar7.y;
  if ((bVar18 & 0x40) != 0) {
    pTVar21 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    if (pTVar21 != (TransformState *)0x0) {
      pMVar20 = TransformState::GetLocalPerspective(pTVar21);
      bVar25 = pMVar20 != (Matrix4f *)0x0;
    }
    fVar28 = (pEVar6->computed_values).rare.perspective;
    if (fVar28 <= 0.0) {
      pTVar21 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      bVar17 = false;
      if (pTVar21 != (TransformState *)0x0) {
        TransformState::SetLocalPerspective(pTVar21,(Matrix4f *)0x0);
        bVar17 = false;
      }
    }
    else {
      RVar8 = (pEVar6->computed_values).rare;
      local_188.vectors[2].w = -1.0 / fVar28;
      uVar3 = (pEVar6->computed_values).rare.perspective_origin_x;
      uVar5 = (pEVar6->computed_values).rare.perspective_origin_y;
      uVar27 = -(uint)(((undefined1  [80])RVar8 & (undefined1  [80])0x10) == (undefined1  [80])0x0);
      uVar31 = -(uint)(((undefined1  [80])RVar8 & (undefined1  [80])0x20) == (undefined1  [80])0x0);
      auVar29._0_8_ =
           CONCAT44(~uVar31 & (uint)((float)uVar5 * 0.01 * fStack_1a4 + fStack_194) |
                    (uint)(fStack_194 + (float)uVar5) & uVar31,
                    ~uVar27 & (uint)((float)uVar3 * 0.01 * local_1a8 + local_198) |
                    (uint)(local_198 + (float)uVar3) & uVar27) ^ 0x8000000080000000;
      auVar29._8_4_ = 0x80000000;
      auVar29._12_4_ = 0x80000000;
      auVar30._4_4_ = fVar28;
      auVar30._0_4_ = fVar28;
      auVar30._8_8_ = 0;
      auVar30 = divps(auVar29,auVar30);
      local_188.vectors[2]._0_8_ = auVar30._0_8_;
      local_188.vectors[2].z = 1.0;
      local_188.vectors[0]._0_12_ = ZEXT812(0x3f800000);
      local_188.vectors[0].w = 0.0;
      local_188.vectors[1].x = 0.0;
      local_188.vectors[1].y = 1.0;
      local_188.vectors[1].z = 0.0;
      local_188.vectors[1].w = 0.0;
      local_188.vectors[3].x = 0.0;
      local_188.vectors[3].y = 0.0;
      local_188.vectors[3].z = 0.0;
      local_188.vectors[3].w = 1.0;
      pTVar21 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar21 == (TransformState *)0x0) {
        pTVar21 = (TransformState *)operator_new(0xc4);
        memset(pTVar21,0,0xc4);
        (this->transform_state)._M_t.
        super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
        super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
        super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = pTVar21;
      }
      bVar17 = TransformState::SetLocalPerspective(pTVar21,&local_188);
    }
    bVar24 = bVar25 != 0.0 < fVar28 | bVar17;
    bVar18 = this->field_0x17 & 0xbf;
    this->field_0x17 = bVar18;
  }
  if ((bVar18 & 0x20) == 0) {
    if (bVar24 == 0) goto LAB_00217879;
  }
  else {
    pTVar21 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    if (pTVar21 == (TransformState *)0x0) {
      uVar27 = 0;
    }
    else {
      pMVar20 = TransformState::GetTransform(pTVar21);
      uVar27 = (uint)(pMVar20 != (Matrix4f *)0x0);
    }
    if (Matrix4<float,Rml::ColumnMajorStorage<float>>::Identity()::identity == '\0') {
      UpdateTransformState();
    }
    local_148.vectors[3].x =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].x;
    local_148.vectors[3].y =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].y;
    local_148.vectors[3].z =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].z;
    local_148.vectors[3].w =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].w;
    local_148.vectors[2].x =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].x;
    local_148.vectors[2].y =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].y;
    local_148.vectors[2].z =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].z;
    local_148.vectors[2].w =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].w;
    local_148.vectors[1].x =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].x;
    local_148.vectors[1].y =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].y;
    local_148.vectors[1].z =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].z;
    local_148.vectors[1].w =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].w;
    local_148.vectors[0].x =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].x;
    local_148.vectors[0].y =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].y;
    local_148.vectors[0].z =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].z;
    local_148.vectors[0].w =
         Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].w;
    Style::ComputedValues::transform((ComputedValues *)&local_108);
    if (local_108 == (Element *)0x0) {
      uVar31 = 0;
    }
    else {
      uVar19 = Transform::GetNumPrimitives((Transform *)local_108);
      uVar31 = 0;
      if (0 < (int)uVar19) {
        uVar10 = local_148.vectors[0]._0_8_;
        uVar11 = local_148.vectors[0]._8_8_;
        uVar12 = local_148.vectors[1]._0_8_;
        uVar13 = local_148.vectors[1]._8_8_;
        uVar14 = local_148.vectors[2]._0_8_;
        uVar15 = local_148.vectors[3]._0_8_;
        uVar16 = local_148.vectors[3]._8_8_;
        do {
          local_148.vectors[3]._8_8_ = uVar16;
          local_148.vectors[3]._0_8_ = uVar15;
          local_148.vectors[2]._0_8_ = uVar14;
          local_148.vectors[1]._8_8_ = uVar13;
          local_148.vectors[1]._0_8_ = uVar12;
          local_148.vectors[0]._8_8_ = uVar11;
          local_148.vectors[0]._0_8_ = uVar10;
          p = Transform::GetPrimitive((Transform *)local_108,uVar31);
          TransformUtilities::ResolveTransform(&local_f8,p,this);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
          MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
          Multiply(&local_148,&local_f8);
          VVar9 = local_188.vectors[0];
          uVar10._0_4_ = local_188.vectors[0].x;
          uVar10._4_4_ = local_188.vectors[0].y;
          local_188.vectors[0]._8_8_ = VVar9._8_8_;
          uVar11._0_4_ = local_188.vectors[0].z;
          uVar11._4_4_ = local_188.vectors[0].w;
          uVar12._0_4_ = local_188.vectors[1].x;
          uVar12._4_4_ = local_188.vectors[1].y;
          uVar13._0_4_ = local_188.vectors[1].z;
          uVar13._4_4_ = local_188.vectors[1].w;
          uVar14._0_4_ = local_188.vectors[2].x;
          uVar14._4_4_ = local_188.vectors[2].y;
          local_148.vectors[2].w = local_188.vectors[2].w;
          local_148.vectors[2].z = local_188.vectors[2].z;
          uVar15._0_4_ = local_188.vectors[3].x;
          uVar15._4_4_ = local_188.vectors[3].y;
          uVar16._0_4_ = local_188.vectors[3].z;
          uVar16._4_4_ = local_188.vectors[3].w;
          local_148.vectors[3].x = local_188.vectors[3].x;
          local_148.vectors[3].y = local_188.vectors[3].y;
          local_148.vectors[3].z = local_188.vectors[3].z;
          local_148.vectors[3].w = local_188.vectors[3].w;
          local_148.vectors[2].x = local_188.vectors[2].x;
          local_148.vectors[2].y = local_188.vectors[2].y;
          local_148.vectors[1].x = local_188.vectors[1].x;
          local_148.vectors[1].y = local_188.vectors[1].y;
          local_148.vectors[1].z = local_188.vectors[1].z;
          local_148.vectors[1].w = local_188.vectors[1].w;
          local_148.vectors[0].x = local_188.vectors[0].x;
          local_148.vectors[0].y = local_188.vectors[0].y;
          local_148.vectors[0].z = local_188.vectors[0].z;
          local_148.vectors[0].w = local_188.vectors[0].w;
          uVar31 = uVar31 + 1;
          local_188.vectors[0] = VVar9;
        } while (uVar19 != uVar31);
        uVar31 = *(uint *)&(pEVar6->computed_values).rare;
        fVar28 = (pEVar6->computed_values).rare.transform_origin_x;
        if ((uVar31 & 0x40) != 0) {
          fVar28 = fVar28 * local_1a8 * 0.01;
        }
        fVar26 = (pEVar6->computed_values).rare.transform_origin_y;
        fVar2 = (pEVar6->computed_values).rare.transform_origin_z;
        if ((char)uVar31 < '\0') {
          fVar26 = fStack_1a4 * fVar26 * 0.01;
        }
        local_78.vectors[0].x = 1.0;
        local_78.vectors[0].y = 0.0;
        local_78.vectors[0].z = 0.0;
        local_78.vectors[0].w = 0.0;
        local_78.vectors[1].x = 0.0;
        local_78.vectors[1].y = 1.0;
        local_78.vectors[1]._8_8_ = 0;
        local_78.vectors[2].x = 0.0;
        local_78.vectors[2].y = 0.0;
        local_78.vectors[2].z = 1.0;
        local_78.vectors[2].w = 0.0;
        local_78.vectors[3].w = 1.0;
        local_78.vectors[3].x = fVar28 + local_198;
        local_78.vectors[3].y = fStack_194 + fVar26;
        local_78.vectors[3].z = fVar2;
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(&local_78,&local_148);
        local_b8.vectors[3].z = -fVar2;
        local_b8.vectors[3]._0_8_ =
             CONCAT44(fStack_194 + fVar26,fVar28 + local_198) ^ 0x8000000080000000;
        local_b8.vectors[0].x = 1.0;
        local_b8.vectors[0].y = 0.0;
        local_b8.vectors[0].z = 0.0;
        local_b8.vectors[0].w = 0.0;
        local_b8.vectors[1].x = 0.0;
        local_b8.vectors[1].y = 1.0;
        local_b8.vectors[1].z = 0.0;
        local_b8.vectors[1].w = 0.0;
        local_b8.vectors[2].x = 0.0;
        local_b8.vectors[2].y = 0.0;
        local_b8.vectors[2].z = 1.0;
        local_b8.vectors[2].w = 0.0;
        local_b8.vectors[3].w = 1.0;
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(&local_f8,&local_b8);
        VVar9 = local_188.vectors[0];
        local_148.vectors[2].w = local_188.vectors[2].w;
        local_148.vectors[2].z = local_188.vectors[2].z;
        local_148.vectors[3].x = local_188.vectors[3].x;
        local_148.vectors[3].y = local_188.vectors[3].y;
        local_148.vectors[3].z = local_188.vectors[3].z;
        local_148.vectors[3].w = local_188.vectors[3].w;
        local_148.vectors[2].x = local_188.vectors[2].x;
        local_148.vectors[2].y = local_188.vectors[2].y;
        local_148.vectors[1].x = local_188.vectors[1].x;
        local_148.vectors[1].y = local_188.vectors[1].y;
        local_148.vectors[1].z = local_188.vectors[1].z;
        local_148.vectors[1].w = local_188.vectors[1].w;
        local_148.vectors[0].x = local_188.vectors[0].x;
        local_148.vectors[0].y = local_188.vectors[0].y;
        local_148.vectors[0].z = local_188.vectors[0].z;
        local_148.vectors[0].w = local_188.vectors[0].w;
        uVar31 = 1;
        local_188.vectors[0] = VVar9;
      }
    }
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    if ((this->parent == (Element *)0x0) ||
       (pTVar21 = (this->parent->transform_state)._M_t.
                  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                  .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl,
       pTVar21 == (TransformState *)0x0)) {
LAB_002177e4:
      if ((char)uVar31 != '\0') goto LAB_002177e9;
      pTVar21 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar21 != (TransformState *)0x0) {
        TransformState::SetTransform(pTVar21,(Matrix4f *)0x0);
      }
    }
    else {
      pMVar20 = TransformState::GetLocalPerspective(pTVar21);
      if (pMVar20 != (Matrix4f *)0x0) {
        Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
        MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
        Multiply(pMVar20,&local_148);
        VVar9 = local_188.vectors[0];
        local_148.vectors[2].w = local_188.vectors[2].w;
        local_148.vectors[2].z = local_188.vectors[2].z;
        local_148.vectors[3].x = local_188.vectors[3].x;
        local_148.vectors[3].y = local_188.vectors[3].y;
        local_148.vectors[3].z = local_188.vectors[3].z;
        local_148.vectors[3].w = local_188.vectors[3].w;
        local_148.vectors[2].x = local_188.vectors[2].x;
        local_148.vectors[2].y = local_188.vectors[2].y;
        local_148.vectors[1].x = local_188.vectors[1].x;
        local_148.vectors[1].y = local_188.vectors[1].y;
        local_148.vectors[1].z = local_188.vectors[1].z;
        local_148.vectors[1].w = local_188.vectors[1].w;
        local_148.vectors[0].x = local_188.vectors[0].x;
        local_148.vectors[0].y = local_188.vectors[0].y;
        local_148.vectors[0].z = local_188.vectors[0].z;
        local_148.vectors[0].w = local_188.vectors[0].w;
        uVar31 = 1;
        local_188.vectors[0] = VVar9;
      }
      pMVar20 = TransformState::GetTransform(pTVar21);
      if (pMVar20 == (Matrix4f *)0x0) goto LAB_002177e4;
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(pMVar20,&local_148);
      VVar9 = local_188.vectors[0];
      local_148.vectors[2].w = local_188.vectors[2].w;
      local_148.vectors[2].z = local_188.vectors[2].z;
      local_148.vectors[3].x = local_188.vectors[3].x;
      local_148.vectors[3].y = local_188.vectors[3].y;
      local_148.vectors[3].z = local_188.vectors[3].z;
      local_148.vectors[3].w = local_188.vectors[3].w;
      local_148.vectors[2].x = local_188.vectors[2].x;
      local_148.vectors[2].y = local_188.vectors[2].y;
      local_148.vectors[1].x = local_188.vectors[1].x;
      local_148.vectors[1].y = local_188.vectors[1].y;
      local_148.vectors[1].z = local_188.vectors[1].z;
      local_148.vectors[1].w = local_188.vectors[1].w;
      local_148.vectors[0].x = local_188.vectors[0].x;
      local_148.vectors[0].y = local_188.vectors[0].y;
      local_148.vectors[0].z = local_188.vectors[0].z;
      local_148.vectors[0].w = local_188.vectors[0].w;
      uVar31 = 1;
      local_188.vectors[0] = VVar9;
LAB_002177e9:
      pTVar21 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar21 == (TransformState *)0x0) {
        pTVar21 = (TransformState *)operator_new(0xc4);
        memset(pTVar21,0,0xc4);
        (this->transform_state)._M_t.
        super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
        super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
        super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = pTVar21;
      }
      bVar25 = TransformState::SetTransform(pTVar21,&local_148);
      bVar24 = bVar24 | bVar25;
    }
    if ((bVar24 == 0) && (uVar27 == uVar31)) goto LAB_00217879;
  }
  puVar22 = (this->children).
            super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar22) {
    uVar23 = 0;
    do {
      puVar1 = &(puVar22[uVar23]._M_t.
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                 super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
      *puVar1 = *puVar1 | 0x20;
      uVar23 = uVar23 + 1;
      puVar22 = (this->children).
                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)((long)(this->children).
                                    super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar22 >> 3)
            );
  }
LAB_00217879:
  pTVar21 = (this->transform_state)._M_t.
            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
  if (((pTVar21 != (TransformState *)0x0) &&
      (pMVar20 = TransformState::GetTransform(pTVar21), pMVar20 == (Matrix4f *)0x0)) &&
     (pMVar20 = TransformState::GetLocalPerspective
                          ((this->transform_state)._M_t.
                           super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                           .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl),
     pMVar20 == (Matrix4f *)0x0)) {
    pTVar21 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    (this->transform_state)._M_t.
    super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
    super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
    super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = (TransformState *)0x0;
    if (pTVar21 != (TransformState *)0x0) {
      operator_delete(pTVar21,0xc4);
    }
  }
  return;
}

Assistant:

void Element::UpdateTransformState()
{
	if (!dirty_perspective && !dirty_transform)
		return;

	const ComputedValues& computed = meta->computed_values;

	const Vector2f pos = GetAbsoluteOffset(BoxArea::Border);
	const Vector2f size = GetBox().GetSize(BoxArea::Border);

	bool perspective_or_transform_changed = false;

	if (dirty_perspective)
	{
		// If perspective is set on this element, then it applies to our children. We just calculate it here,
		// and let the children's transform update merge it with their transform.
		bool had_perspective = (transform_state && transform_state->GetLocalPerspective());

		float distance = computed.perspective();
		Vector2f vanish = Vector2f(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f);
		bool have_perspective = false;

		if (distance > 0.0f)
		{
			have_perspective = true;

			// Compute the vanishing point from the perspective origin
			if (computed.perspective_origin_x().type == Style::PerspectiveOrigin::Percentage)
				vanish.x = pos.x + computed.perspective_origin_x().value * 0.01f * size.x;
			else
				vanish.x = pos.x + computed.perspective_origin_x().value;

			if (computed.perspective_origin_y().type == Style::PerspectiveOrigin::Percentage)
				vanish.y = pos.y + computed.perspective_origin_y().value * 0.01f * size.y;
			else
				vanish.y = pos.y + computed.perspective_origin_y().value;
		}

		if (have_perspective)
		{
			// Equivalent to: Translate(x,y,0) * Perspective(distance) * Translate(-x,-y,0)
			Matrix4f perspective = Matrix4f::FromRows( //
				{1, 0, -vanish.x / distance, 0},       //
				{0, 1, -vanish.y / distance, 0},       //
				{0, 0, 1, 0},                          //
				{0, 0, -1 / distance, 1}               //
			);

			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetLocalPerspective(&perspective);
		}
		else if (transform_state)
			transform_state->SetLocalPerspective(nullptr);

		perspective_or_transform_changed |= (have_perspective != had_perspective);

		dirty_perspective = false;
	}

	if (dirty_transform)
	{
		// We want to find the accumulated transform given all our ancestors. It is assumed here that the parent transform is already updated,
		// so that we only need to consider our local transform and combine it with our parent's transform and perspective matrices.
		bool had_transform = (transform_state && transform_state->GetTransform());

		bool have_transform = false;
		Matrix4f transform = Matrix4f::Identity();

		if (TransformPtr transform_ptr = computed.transform())
		{
			// First find the current element's transform
			const int n = transform_ptr->GetNumPrimitives();
			for (int i = 0; i < n; ++i)
			{
				const TransformPrimitive& primitive = transform_ptr->GetPrimitive(i);
				Matrix4f matrix = TransformUtilities::ResolveTransform(primitive, *this);
				transform *= matrix;
				have_transform = true;
			}

			if (have_transform)
			{
				// Compute the transform origin
				Vector3f transform_origin(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f, 0);

				if (computed.transform_origin_x().type == Style::TransformOrigin::Percentage)
					transform_origin.x = pos.x + computed.transform_origin_x().value * size.x * 0.01f;
				else
					transform_origin.x = pos.x + computed.transform_origin_x().value;

				if (computed.transform_origin_y().type == Style::TransformOrigin::Percentage)
					transform_origin.y = pos.y + computed.transform_origin_y().value * size.y * 0.01f;
				else
					transform_origin.y = pos.y + computed.transform_origin_y().value;

				transform_origin.z = computed.transform_origin_z();

				// Make the transformation apply relative to the transform origin
				transform = Matrix4f::Translate(transform_origin) * transform * Matrix4f::Translate(-transform_origin);
			}

			// We may want to include the local offsets here, as suggested by the CSS specs, so that the local transform is applied after the offset I
			// believe the motivation is. Then we would need to subtract the absolute zero-offsets during geometry submit whenever we have transforms.
		}

		if (parent && parent->transform_state)
		{
			// Apply the parent's local perspective and transform.
			// @performance: If we have no local transform and no parent perspective, we can effectively just point to the parent transform instead of
			// copying it.
			const TransformState& parent_state = *parent->transform_state;

			if (auto parent_perspective = parent_state.GetLocalPerspective())
			{
				transform = *parent_perspective * transform;
				have_transform = true;
			}

			if (auto parent_transform = parent_state.GetTransform())
			{
				transform = *parent_transform * transform;
				have_transform = true;
			}
		}

		if (have_transform)
		{
			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetTransform(&transform);
		}
		else if (transform_state)
			transform_state->SetTransform(nullptr);

		perspective_or_transform_changed |= (had_transform != have_transform);
	}

	// A change in perspective or transform will require an update to children transforms as well.
	if (perspective_or_transform_changed)
	{
		for (size_t i = 0; i < children.size(); i++)
			children[i]->DirtyTransformState(false, true);
	}

	// No reason to keep the transform state around if transform and perspective have been removed.
	if (transform_state && !transform_state->GetTransform() && !transform_state->GetLocalPerspective())
	{
		transform_state.reset();
	}
}